

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::STLImporter::InternReadFile
          (STLImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  aiNode *this_00;
  aiMaterial *this_01;
  aiMaterial **ppaVar5;
  runtime_error *prVar6;
  long *plVar7;
  long *plVar8;
  vector<char,_std::allocator<char>_> buffer2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  vector<char,_std::allocator<char>_> local_458;
  aiString local_438;
  IOStream *stream;
  
  pcVar1 = local_438.data + 0xc;
  local_438._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"rb","");
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_438._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  if ((char *)local_438._0_8_ != pcVar1) {
    operator_delete((void *)local_438._0_8_,
                    CONCAT44(local_438.data._16_4_,local_438.data._12_4_) + 1);
  }
  if (stream != (IOStream *)0x0) {
    uVar4 = (*stream->_vptr_IOStream[6])(stream);
    this->fileSize = uVar4;
    local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer(stream,&local_458,FORBID_EMPTY);
    this->pScene = pScene;
    this->mBuffer =
         local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (this->clrColorDefault).r = 0.6;
    (this->clrColorDefault).g = 0.6;
    (this->clrColorDefault).b = 0.6;
    (this->clrColorDefault).a = 0.6;
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    uVar4 = this->fileSize;
    if ((uVar4 < 0x54) || (*(int *)(this->mBuffer + 0x50) * 0x32 + 0x54U != uVar4)) {
      bVar2 = anon_unknown.dwarf_15332ff::IsAsciiSTL(this->mBuffer,uVar4);
      if (!bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_478,"Failed to determine STL storage representation for ",pFile);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_478);
        local_438._0_8_ = *plVar7;
        plVar8 = plVar7 + 2;
        if ((long *)local_438._0_8_ == plVar8) {
          local_438.data._20_8_ = plVar7[3];
          local_438.data._12_4_ = SUB84(*plVar8,0);
          local_438.data._16_4_ = SUB84((ulong)*plVar8 >> 0x20,0);
          local_438._0_8_ = pcVar1;
        }
        else {
          local_438.data._12_4_ = SUB84(*plVar8,0);
          local_438.data._16_4_ = SUB84((ulong)*plVar8 >> 0x20,0);
        }
        local_438.data._4_4_ = SUB84(plVar7[1],0);
        local_438.data._8_4_ = SUB84((ulong)plVar7[1] >> 0x20,0);
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_438);
        *(undefined ***)prVar6 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      LoadASCIIFile(this,this_00);
      bVar2 = false;
    }
    else {
      bVar2 = LoadBinaryFile(this);
    }
    this_01 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_01);
    memset(local_438.data + 0x10,0x1b,0x3f0);
    local_438.length = 0xf;
    builtin_strncpy(local_438.data,"DefaultMaterial",0x10);
    aiMaterial::AddProperty(this_01,&local_438,"?mat.name",0,0);
    local_478._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_478._M_string_length = 0x3f8000003f800000;
    if (bVar2 != false) {
      local_478._M_dataplus._M_p = *(pointer *)&this->clrColorDefault;
      local_478._M_string_length._0_4_ = (this->clrColorDefault).b;
      local_478._M_string_length._4_4_ = (this->clrColorDefault).a;
    }
    aiMaterial::AddBinaryProperty(this_01,&local_478,0x10,"$clr.diffuse",0,0,aiPTI_Float);
    aiMaterial::AddBinaryProperty(this_01,&local_478,0x10,"$clr.specular",0,0,aiPTI_Float);
    local_478._M_dataplus._M_p = (pointer)0x3d4ccccd3d4ccccd;
    local_478._M_string_length = 0x3f8000003d4ccccd;
    aiMaterial::AddBinaryProperty(this_01,&local_478,0x10,"$clr.ambient",0,0,aiPTI_Float);
    pScene->mNumMaterials = 1;
    ppaVar5 = (aiMaterial **)operator_new__(8);
    pScene->mMaterials = ppaVar5;
    *ppaVar5 = this_01;
    this->mBuffer = (char *)0x0;
    if (local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    (*stream->_vptr_IOStream[1])(stream);
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_478,"Failed to open STL file ",pFile);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_478);
  local_438._0_8_ = *plVar7;
  plVar8 = plVar7 + 2;
  if ((long *)local_438._0_8_ == plVar8) {
    local_438.data._20_8_ = plVar7[3];
    local_438.data._12_4_ = SUB84(*plVar8,0);
    local_438.data._16_4_ = SUB84((ulong)*plVar8 >> 0x20,0);
    local_438._0_8_ = pcVar1;
  }
  else {
    local_438.data._12_4_ = SUB84(*plVar8,0);
    local_438.data._16_4_ = SUB84((ulong)*plVar8 >> 0x20,0);
  }
  local_438.data._4_4_ = SUB84(plVar7[1],0);
  local_438.data._8_4_ = SUB84((ulong)plVar7[1] >> 0x20,0);
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::runtime_error::runtime_error(prVar6,(string *)&local_438);
  *(undefined ***)prVar6 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void STLImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler )
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open STL file " + pFile + ".");
    }

    fileSize = (unsigned int)file->FileSize();

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> buffer2;
    TextFileToBuffer(file.get(),buffer2);

    this->pScene = pScene;
    this->mBuffer = &buffer2[0];

    // the default vertex color is light gray.
    clrColorDefault.r = clrColorDefault.g = clrColorDefault.b = clrColorDefault.a = (ai_real) 0.6;

    // allocate a single node
    pScene->mRootNode = new aiNode();

    bool bMatClr = false;

    if (IsBinarySTL(mBuffer, fileSize)) {
        bMatClr = LoadBinaryFile();
    } else if (IsAsciiSTL(mBuffer, fileSize)) {
        LoadASCIIFile( pScene->mRootNode );
    } else {
        throw DeadlyImportError( "Failed to determine STL storage representation for " + pFile + ".");
    }

    // create a single default material, using a white diffuse color for consistency with
    // other geometric types (e.g., PLY).
    aiMaterial* pcMat = new aiMaterial();
    aiString s;
    s.Set(AI_DEFAULT_MATERIAL_NAME);
    pcMat->AddProperty(&s, AI_MATKEY_NAME);

    aiColor4D clrDiffuse(ai_real(1.0),ai_real(1.0),ai_real(1.0),ai_real(1.0));
    if (bMatClr) {
        clrDiffuse = clrColorDefault;
    }
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_DIFFUSE);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_SPECULAR);
    clrDiffuse = aiColor4D( ai_real(0.05), ai_real(0.05), ai_real(0.05), ai_real(1.0));
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_AMBIENT);

    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;

    mBuffer = nullptr;
}